

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O1

DecompressResult
tcu::astc::anon_unknown_0::decompressBlock
          (void *dst,Block128 *blockData,int blockWidth,int blockHeight,bool isSRGB,bool isLDR)

{
  ColorEndpointPair *e0;
  char cVar1;
  Word WVar2;
  ulong uVar3;
  sbyte sVar4;
  deFloat16 val16;
  int i_1;
  DecompressResult DVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  undefined1 *puVar11;
  InternalError *this;
  byte bVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  deUint32 dVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  byte bVar20;
  byte bVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  uint *puVar27;
  ISEMode IVar28;
  ulong uVar29;
  int channelNdx;
  uint uVar30;
  deUint32 *pdVar31;
  undefined1 uVar32;
  int iVar33;
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  ISEMode IVar38;
  int c_1;
  uint uVar39;
  uint uVar40;
  deUint32 dVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  UVec4 *e1;
  bool bVar46;
  bool bVar47;
  float fVar48;
  int local_a1c;
  ASTCBlockMode blockMode;
  DecompressResult local_9c4;
  int local_9b0;
  int local_9ac;
  deUint32 colorEndpointModes [4];
  ColorEndpointPair colorEndpoints [4];
  ISEParams local_8b8 [32];
  deUint32 rgba [4];
  bool local_7a8 [4];
  int local_7a4;
  deUint32 local_7a0;
  uint local_79c [185];
  TexelWeightPair texelWeights [144];
  
  uVar26 = blockData->m_words[0];
  blockMode.isError = true;
  blockMode.isDualPlane = true;
  blockMode.weightGridWidth = -1;
  blockMode.weightGridHeight = -1;
  blockMode.weightISEParams.mode = ISEMODE_LAST;
  blockMode.weightISEParams.numBits = -1;
  uVar13 = (uint)uVar26;
  blockMode.isVoidExtent = (uVar13 & 0x1ff) == 0x1fc;
  if (blockMode.isVoidExtent) {
switchD_00acb84d_default:
    blockMode.isError = false;
  }
  else if ((uVar26 & 3) == 0) {
    if ((uVar26 & 0xc) != 0 && (~uVar13 & 0x1c0) != 0) goto LAB_00acad98;
  }
  else if ((uVar26 & 0xf) != 0) {
LAB_00acad98:
    if ((uVar26 & 3) == 0) {
      uVar39 = uVar13 >> 1;
      uVar22 = (uint)(uVar26 >> 7) & 3;
      if (uVar22 == 3) {
        blockMode.weightGridHeight = (uint)((uVar26 & 0x20) == 0) * 4 + 6;
        blockMode.weightGridWidth = ((uVar13 & 0x20) >> 3) + 6;
      }
      else {
        uVar40 = (uint)(uVar26 >> 5) & 3;
        if (uVar22 == 2) {
          blockMode.weightGridHeight = ((uint)(uVar26 >> 9) & 3) + 6;
          blockMode.weightGridWidth = uVar40 + 6;
        }
        else if (uVar22 == 1) {
          blockMode.weightGridHeight = 0xc;
          blockMode.weightGridWidth = uVar40 + 2;
        }
        else {
          blockMode.weightGridWidth = 0xc;
          blockMode.weightGridHeight = uVar40 + 2;
        }
      }
    }
    else {
      uVar7 = (uint)(uVar26 >> 2) & 3;
      uVar40 = (uint)(uVar26 >> 5) & 3;
      uVar39 = uVar13 * 2;
      uVar22 = (uint)(uVar26 >> 7);
      if (uVar7 == 3) {
        uVar22 = uVar22 & 1;
        blockMode.weightGridWidth = uVar40 + 2;
        blockMode.weightGridHeight = uVar22 | 6;
        if ((uVar13 >> 8 & 1) != 0) {
          blockMode.weightGridHeight = blockMode.weightGridWidth;
          blockMode.weightGridWidth = uVar22 + 2;
        }
      }
      else {
        uVar22 = uVar22 & 3;
        if (uVar7 == 2) {
          blockMode.weightGridHeight = uVar22 | 8;
          blockMode.weightGridWidth = uVar40 + 2;
        }
        else {
          if (uVar7 == 1) {
            blockMode.weightGridWidth = uVar22 | 8;
          }
          else {
            blockMode.weightGridWidth = uVar22 | 4;
          }
          blockMode.weightGridHeight = uVar40 + 2;
        }
      }
    }
    uVar39 = uVar39 & 6 | (uint)(uVar26 >> 4) & 1;
    bVar46 = (uVar13 & 0x183) == 0x100;
    blockMode.isDualPlane = (bool)((byte)(uVar13 >> 10) & 1);
    if (bVar46) {
      blockMode.isDualPlane = false;
    }
    blockMode.weightISEParams.mode = ISEMODE_PLAIN_BIT;
    blockMode.weightISEParams.numBits = 0;
    if (bVar46 || (uVar13 >> 9 & 1) == 0) {
      switch(uVar39) {
      case 2:
        blockMode.weightISEParams.mode = ISEMODE_PLAIN_BIT;
        blockMode.weightISEParams.numBits = 1;
        break;
      case 3:
        blockMode.weightISEParams.mode = ISEMODE_TRIT;
        blockMode.weightISEParams.numBits = 0;
        break;
      case 4:
        blockMode.weightISEParams.mode = ISEMODE_PLAIN_BIT;
        blockMode.weightISEParams.numBits = 2;
        break;
      case 5:
        blockMode.weightISEParams.mode = ISEMODE_QUINT;
        blockMode.weightISEParams.numBits = 0;
        break;
      case 6:
        blockMode.weightISEParams.mode = ISEMODE_TRIT;
        blockMode.weightISEParams.numBits = 1;
        break;
      case 7:
        blockMode.weightISEParams.mode = ISEMODE_PLAIN_BIT;
        blockMode.weightISEParams.numBits = 3;
      }
    }
    else {
      switch(uVar39) {
      case 2:
        blockMode.weightISEParams.mode = ISEMODE_QUINT;
        blockMode.weightISEParams.numBits = 1;
        break;
      case 3:
        blockMode.weightISEParams.mode = ISEMODE_TRIT;
        blockMode.weightISEParams.numBits = 2;
        break;
      case 4:
        blockMode.weightISEParams.mode = ISEMODE_PLAIN_BIT;
        blockMode.weightISEParams.numBits = 4;
        break;
      case 5:
        blockMode.weightISEParams.mode = ISEMODE_QUINT;
        blockMode.weightISEParams.numBits = 2;
        break;
      case 6:
        blockMode.weightISEParams.mode = ISEMODE_TRIT;
        blockMode.weightISEParams.numBits = 3;
        break;
      case 7:
        blockMode.weightISEParams.mode = ISEMODE_PLAIN_BIT;
        blockMode.weightISEParams.numBits = 5;
      }
    }
    goto switchD_00acb84d_default;
  }
  if (blockMode.isError == true) {
    uVar13 = blockHeight * blockWidth;
    if (!isSRGB) {
      if ((int)uVar13 < 1) {
        return DECOMPRESS_RESULT_ERROR;
      }
      lVar19 = 0;
      do {
        iVar14 = (int)lVar19;
        *(undefined4 *)((long)dst + (long)iVar14 * 4) = 0x3f800000;
        *(undefined4 *)((long)dst + (long)(iVar14 + 1) * 4) = 0;
        *(undefined4 *)((long)dst + (long)(iVar14 + 2) * 4) = 0x3f800000;
        *(undefined4 *)((long)dst + (long)(iVar14 + 3) * 4) = 0x3f800000;
        lVar19 = lVar19 + 4;
      } while ((ulong)uVar13 << 2 != lVar19);
      return DECOMPRESS_RESULT_ERROR;
    }
    if ((int)uVar13 < 1) {
      return DECOMPRESS_RESULT_ERROR;
    }
    lVar19 = 0;
    do {
      iVar14 = (int)lVar19;
      *(undefined1 *)((long)dst + (long)iVar14) = 0xff;
      *(undefined2 *)((long)dst + (long)(iVar14 + 1)) = 0xff00;
      *(undefined1 *)((long)dst + (long)(iVar14 + 3)) = 0xff;
      lVar19 = lVar19 + 4;
    } while ((ulong)uVar13 << 2 != lVar19);
    return DECOMPRESS_RESULT_ERROR;
  }
  if ((uVar13 & 0x1ff) == 0x1fc) {
    uVar26 = blockData->m_words[0];
    if ((isLDR & (byte)(uVar26 >> 9)) == 0) {
      uVar39 = (uint)(uVar26 >> 0xc);
      uVar22 = (uint)(uVar26 >> 0x19) & 0x1fff;
      uVar13 = (uint)(uVar26 >> 0x20);
      uVar40 = uVar13 >> 0x13;
      uVar13 = uVar13 >> 6;
      if (((uVar40 == 0x1fff) && ((uVar39 & 0xfffff & uVar13 & uVar22) == 0x1fff)) ||
         ((uVar39 & 0x1fff) < uVar22 && (uVar13 & 0x1fff) < uVar40)) {
        WVar2 = blockData->m_words[1];
        rgba._0_8_ = CONCAT44((int)(WVar2 >> 0x10),(int)WVar2) & 0xffff0000ffff;
        rgba[2] = (uint)(WVar2 >> 0x20) & 0xffff;
        rgba[3] = (uint)(ushort)(WVar2 >> 0x30);
        if (isSRGB) {
          if (0 < blockHeight * blockWidth) {
            iVar14 = 0;
            uVar26 = 0;
            do {
              lVar19 = 0;
              do {
                *(undefined1 *)((long)dst + lVar19 + iVar14) =
                     *(undefined1 *)((long)rgba + lVar19 * 4 + 1);
                lVar19 = lVar19 + 1;
              } while (lVar19 != 4);
              uVar26 = uVar26 + 1;
              iVar14 = iVar14 + 4;
            } while (uVar26 != (uint)(blockHeight * blockWidth));
          }
        }
        else if (((uint)uVar26 >> 9 & 1) == 0) {
          if (0 < blockHeight * blockWidth) {
            iVar14 = 0;
            uVar26 = 0;
            do {
              lVar19 = 0;
              do {
                fVar48 = 1.0;
                if (rgba[lVar19] != 0xffff) {
                  fVar48 = (float)rgba[lVar19] * 1.5258789e-05;
                }
                *(float *)((long)dst + lVar19 * 4 + (long)iVar14 * 4) = fVar48;
                lVar19 = lVar19 + 1;
              } while (lVar19 != 4);
              uVar26 = uVar26 + 1;
              iVar14 = iVar14 + 4;
            } while (uVar26 != (uint)(blockHeight * blockWidth));
          }
        }
        else {
          lVar19 = 0;
          do {
            if ((~rgba[lVar19] & 0x7c00) == 0) {
              this = (InternalError *)__cxa_allocate_exception(0x38);
              texelWeights[0].w = (deUint32  [2])(texelWeights + 2);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)texelWeights,
                         "Infinity or NaN color component in HDR void extent block in ASTC texture (behavior undefined by ASTC specification)"
                         ,"");
              InternalError::InternalError(this,(string *)texelWeights);
              __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 != 4);
          if (0 < blockHeight * blockWidth) {
            iVar14 = 0;
            uVar26 = 0;
            do {
              lVar19 = 0;
              do {
                fVar48 = deFloat16To32((deFloat16)rgba[lVar19]);
                *(float *)((long)dst + lVar19 * 4 + (long)iVar14 * 4) = fVar48;
                lVar19 = lVar19 + 1;
              } while (lVar19 != 4);
              uVar26 = uVar26 + 1;
              iVar14 = iVar14 + 4;
            } while (uVar26 != (uint)(blockHeight * blockWidth));
          }
        }
        return DECOMPRESS_RESULT_VALID_BLOCK;
      }
    }
    uVar13 = blockHeight * blockWidth;
    if (!isSRGB) {
      if ((int)uVar13 < 1) {
        return DECOMPRESS_RESULT_ERROR;
      }
      lVar19 = 0;
      do {
        iVar14 = (int)lVar19;
        *(undefined4 *)((long)dst + (long)iVar14 * 4) = 0x3f800000;
        *(undefined4 *)((long)dst + (long)(iVar14 + 1) * 4) = 0;
        *(undefined4 *)((long)dst + (long)(iVar14 + 2) * 4) = 0x3f800000;
        *(undefined4 *)((long)dst + (long)(iVar14 + 3) * 4) = 0x3f800000;
        lVar19 = lVar19 + 4;
      } while ((ulong)uVar13 << 2 != lVar19);
      return DECOMPRESS_RESULT_ERROR;
    }
    if ((int)uVar13 < 1) {
      return DECOMPRESS_RESULT_ERROR;
    }
    lVar19 = 0;
    do {
      iVar14 = (int)lVar19;
      *(undefined1 *)((long)dst + (long)iVar14) = 0xff;
      *(undefined2 *)((long)dst + (long)(iVar14 + 1)) = 0xff00;
      *(undefined1 *)((long)dst + (long)(iVar14 + 3)) = 0xff;
      lVar19 = lVar19 + 4;
    } while ((ulong)uVar13 << 2 != lVar19);
    return DECOMPRESS_RESULT_ERROR;
  }
  iVar14 = blockMode.weightGridHeight * blockMode.weightGridWidth << blockMode.isDualPlane;
  if (blockMode.weightISEParams.mode == ISEMODE_PLAIN_BIT) {
    iVar33 = blockMode.weightISEParams.numBits * iVar14;
  }
  else {
    if (blockMode.weightISEParams.mode == ISEMODE_QUINT) {
      iVar33 = (iVar14 * 7) / 3;
      bVar46 = iVar14 * -0x55555553 + 0x2aaaaaaaU < 0x55555555;
    }
    else {
      iVar33 = -1;
      if (blockMode.weightISEParams.mode != ISEMODE_TRIT) goto LAB_00acafd8;
      iVar33 = (iVar14 * 8) / 5;
      bVar46 = iVar14 * 0x66666668 + 0x19999999U < 0x33333333;
    }
    iVar33 = blockMode.weightISEParams.numBits * iVar14 + ((iVar33 + 1) - (uint)bVar46);
  }
LAB_00acafd8:
  if ((blockMode.weightGridHeight <= blockHeight &&
      (blockMode.weightGridWidth <= blockWidth && iVar14 < 0x41)) && 0xffffffb6 < iVar33 - 0x61U) {
    uVar26 = blockData->m_words[0];
    uVar3 = uVar26 >> 0xb;
    uVar39 = (uint)uVar3 & 3;
    uVar13 = uVar39 + 1;
    uVar29 = (ulong)uVar13;
    if ((uVar13 != 4) || (blockMode.isDualPlane == false)) {
      bVar46 = (uVar3 & 3) == 0;
      bVar47 = (uVar26 & 0x1800000) == 0;
      iVar14 = -0x1d;
      if (!bVar47 && !bVar46) {
        iVar14 = uVar13 * -3 + -0x19;
      }
      iVar9 = -0x11;
      if ((uVar3 & 3) != 0) {
        iVar9 = iVar14;
      }
      if (uVar13 == 4 || (bVar47 || bVar46)) {
        iVar14 = (uint)(bVar47 || bVar46) * 8 + -7;
      }
      else {
        iVar14 = -4;
        if (uVar13 != 3) {
          iVar14 = -(uint)(uVar13 == 2);
        }
      }
      iVar15 = iVar14 - iVar33;
      if ((uVar3 & 3) == 0) {
        colorEndpointModes[0] = (uint)uVar26 >> 0xd & 0xf;
      }
      else if ((uVar26 >> 0x17 & 3) == 0) {
        uVar35 = 0;
        do {
          colorEndpointModes[uVar35] = (uint)uVar26 >> 0x19 & 0xf;
          uVar35 = uVar35 + 1;
        } while (uVar29 != uVar35);
      }
      else {
        uVar35 = 0x19;
        uVar37 = 0xfffffffffffffffe;
        do {
          iVar17 = (int)uVar35;
          iVar6 = iVar17 + 0x3f;
          if (-1 < iVar17) {
            iVar6 = iVar17;
          }
          iVar17 = (int)uVar37;
          iVar8 = iVar15 + 0x7b;
          if (iVar17 + uVar39 + 3 < 4) {
            iVar8 = 0x19;
          }
          uVar40 = iVar8 + iVar17 + uVar39 + 3;
          uVar22 = iVar17 + uVar39 + iVar8 + 0x42;
          if (-1 < (int)uVar40) {
            uVar22 = uVar40;
          }
          iVar8 = ((iVar14 + uVar39) - iVar33) + 0x7f;
          if (iVar17 + uVar39 + 4 < 4) {
            iVar8 = uVar39 + 0x1d;
          }
          iVar8 = iVar8 + iVar17;
          iVar17 = iVar8 + 0x3f;
          if (-1 < iVar8) {
            iVar17 = iVar8;
          }
          *(uint *)((long)colorEndpointModes + uVar37 * 2 + 4) =
               ((((uint)(uVar26 >> 0x17) & 3) - 1) +
               (uint)((blockData->m_words[iVar6 >> 6] >> (uVar35 & 0x3f) & 1) != 0)) * 4 +
               ((uint)(blockData->m_words[iVar17 >> 6] >> ((byte)iVar8 & 0x3f)) & 1) * 2 |
               (uint)((blockData->m_words[(int)uVar22 >> 6] >> ((ulong)uVar40 & 0x3f) & 1) != 0);
          uVar35 = uVar35 + 1;
          uVar37 = uVar37 + 2;
        } while (uVar39 * 2 != uVar37);
      }
      dVar41 = ((uint)(blockMode.isDualPlane ^ 1) * 2 - iVar33) + iVar9 + 0x7e;
      uVar26 = 0;
      uVar22 = 0;
      do {
        uVar22 = uVar22 + (colorEndpointModes[uVar26] >> 2) * 2 + 2;
        uVar26 = uVar26 + 1;
      } while (uVar29 != uVar26);
      if ((0x12 < (int)uVar22) ||
         ((int)dVar41 <
          (int)(((int)(uVar22 * 0xd) / 5 + 1) -
               (uint)(uVar22 * 0x66666669 + 0x19999999 < 0x33333333)))) {
        uVar13 = blockHeight * blockWidth;
        if (!isSRGB) {
          if ((int)uVar13 < 1) {
            return DECOMPRESS_RESULT_ERROR;
          }
          lVar19 = 0;
          do {
            iVar14 = (int)lVar19;
            *(undefined4 *)((long)dst + (long)iVar14 * 4) = 0x3f800000;
            *(undefined4 *)((long)dst + (long)(iVar14 + 1) * 4) = 0;
            *(undefined4 *)((long)dst + (long)(iVar14 + 2) * 4) = 0x3f800000;
            *(undefined4 *)((long)dst + (long)(iVar14 + 3) * 4) = 0x3f800000;
            lVar19 = lVar19 + 4;
          } while ((ulong)uVar13 << 2 != lVar19);
          return DECOMPRESS_RESULT_ERROR;
        }
        if ((int)uVar13 < 1) {
          return DECOMPRESS_RESULT_ERROR;
        }
        lVar19 = 0;
        do {
          iVar14 = (int)lVar19;
          *(undefined1 *)((long)dst + (long)iVar14) = 0xff;
          *(undefined2 *)((long)dst + (long)(iVar14 + 1)) = 0xff00;
          *(undefined1 *)((long)dst + (long)(iVar14 + 3)) = 0xff;
          lVar19 = lVar19 + 4;
        } while ((ulong)uVar13 << 2 != lVar19);
        return DECOMPRESS_RESULT_ERROR;
      }
      colorEndpoints[3].e1.m_data[0] = 0;
      colorEndpoints[3].e1.m_data[1] = 0;
      colorEndpoints[3].e1.m_data[2] = 0;
      colorEndpoints[3].e1.m_data[3] = 0;
      colorEndpoints[3].e0.m_data[0] = 0;
      colorEndpoints[3].e0.m_data[1] = 0;
      colorEndpoints[3].e0.m_data[2] = 0;
      colorEndpoints[3].e0.m_data[3] = 0;
      colorEndpoints[2].e1.m_data[0] = 0;
      colorEndpoints[2].e1.m_data[1] = 0;
      colorEndpoints[2].e1.m_data[2] = 0;
      colorEndpoints[2].e1.m_data[3] = 0;
      colorEndpoints[2].e0.m_data[0] = 0;
      colorEndpoints[2].e0.m_data[1] = 0;
      colorEndpoints[2].e0.m_data[2] = 0;
      colorEndpoints[2].e0.m_data[3] = 0;
      colorEndpoints[1].e1.m_data[0] = 0;
      colorEndpoints[1].e1.m_data[1] = 0;
      colorEndpoints[1].e1.m_data[2] = 0;
      colorEndpoints[1].e1.m_data[3] = 0;
      colorEndpoints[1].e0.m_data[0] = 0;
      colorEndpoints[1].e0.m_data[1] = 0;
      colorEndpoints[1].e0.m_data[2] = 0;
      colorEndpoints[1].e0.m_data[3] = 0;
      colorEndpoints[0].e1.m_data[0] = 0;
      colorEndpoints[0].e1.m_data[1] = 0;
      colorEndpoints[0].e1.m_data[2] = 0;
      colorEndpoints[0].e1.m_data[3] = 0;
      colorEndpoints[0].e0.m_data[0] = 0;
      colorEndpoints[0].e0.m_data[1] = 0;
      colorEndpoints[0].e0.m_data[2] = 0;
      colorEndpoints[0].e0.m_data[3] = 0;
      local_8b8[0] = computeMaximumRangeISEParams(dVar41,uVar22);
      rgba[2] = 0x1d;
      if ((uVar3 & 3) == 0) {
        rgba[2] = 0x11;
      }
      local_7a8[0] = true;
      local_7a4 = 0;
      rgba._0_8_ = blockData;
      rgba[3] = dVar41;
      decodeISE((ISEDecodedResult *)texelWeights,uVar22,(BitAccessStream *)rgba,local_8b8);
      if (local_8b8[0].mode < ISEMODE_PLAIN_BIT) {
        if (0 < (int)uVar22) {
          uVar40 = (-1 - (uint)(local_8b8[0].mode == ISEMODE_TRIT)) + local_8b8[0].numBits * 2;
          iVar14 = *(int *)(astc::(anonymous_namespace)::
                            unquantizeColorEndpoints(unsigned_int*,tcu::astc::(anonymous_namespace)::ISEDecodedResult_const*,int,tcu::astc::(anonymous_namespace)::ISEParams_const&)
                            ::Ca + (long)(int)uVar40 * 4);
          pdVar31 = texelWeights[0].w + 1;
          uVar26 = 0;
          do {
            uVar43 = ((TexelWeightPair *)(pdVar31 + -1))->w[0];
            uVar7 = 0;
            if (uVar40 < 2) goto LAB_00acb61f;
            if (8 < uVar40 - 2) {
              uVar7 = 0xffffffff;
              goto LAB_00acb61f;
            }
            uVar44 = uVar43 >> 1 & 1;
            uVar34 = uVar43 >> 2 & 1;
            uVar45 = uVar43 >> 3 & 1;
            uVar18 = uVar43 >> 4 & 1;
            switch(uVar40) {
            case 2:
              uVar7 = uVar44 * 0x116;
              break;
            case 3:
              uVar7 = uVar44 * 0x10c;
              break;
            case 4:
              iVar33 = (uVar44 << 7 | uVar34 << 8) + uVar34 * 8 + uVar44 * 4;
              goto LAB_00acb6e1;
            case 5:
              uVar7 = (uVar44 << 7 | uVar34 << 8) + uVar34 * 4 + uVar44 * 2;
              goto LAB_00acb74f;
            case 6:
              iVar33 = (uVar44 << 6 | uVar34 << 7 | uVar45 << 8) + uVar45 * 4;
LAB_00acb6e1:
              uVar7 = iVar33 + uVar34 * 2 | uVar44;
              break;
            case 7:
              uVar7 = (uVar44 << 6 | uVar34 << 7 | uVar45 << 8) + uVar45 * 2;
LAB_00acb74f:
              uVar7 = uVar7 | uVar34;
              break;
            case 8:
              uVar7 = (uVar44 << 5 | uVar34 << 6 | uVar45 << 7 | uVar18 << 8) + uVar18 * 2 | uVar45;
              break;
            case 9:
              uVar7 = uVar44 << 5 | uVar34 << 6 | uVar45 << 7 | uVar18 << 8 | uVar18;
              break;
            case 10:
              uVar7 = uVar43 >> 5 & 1;
              uVar7 = uVar44 << 4 | uVar34 << 5 | uVar45 << 6 | uVar18 << 7 | uVar7 << 8 | uVar7;
            }
LAB_00acb61f:
            rgba[uVar26] = -(uVar43 & 1) & 0x80 |
                           (*pdVar31 * iVar14 + uVar7 ^ -(uVar43 & 1) & 0x1ff) >> 2;
            uVar26 = uVar26 + 1;
            pdVar31 = pdVar31 + 3;
          } while (uVar22 != uVar26);
        }
      }
      else if (0 < (int)uVar22) {
        iVar14 = -local_8b8[0].numBits;
        iVar33 = 8 - local_8b8[0].numBits;
        uVar26 = 0;
        do {
          uVar40 = 0;
          if (iVar33 != iVar14 && SBORROW4(iVar33,iVar14) == iVar33 + local_8b8[0].numBits < 0) {
            uVar7 = *(uint *)((long)texelWeights + uVar26 * 0xc + 8);
            uVar40 = 0;
            iVar9 = iVar33;
            iVar17 = local_8b8[0].numBits + -8;
            do {
              uVar43 = uVar7 >> ((byte)iVar17 & 0x1f);
              if (-1 < iVar9) {
                uVar43 = uVar7 << ((byte)iVar9 & 0x1f);
              }
              uVar40 = uVar40 | uVar43;
              iVar9 = iVar9 - local_8b8[0].numBits;
              iVar17 = iVar17 + local_8b8[0].numBits;
            } while (iVar9 != iVar14 && SBORROW4(iVar9,iVar14) == iVar9 + local_8b8[0].numBits < 0);
          }
          rgba[uVar26] = uVar40;
          uVar26 = uVar26 + 1;
        } while (uVar26 != uVar22);
      }
      uVar26 = 0;
      e1 = &colorEndpoints[0].e1;
      iVar14 = 0;
      do {
        uVar22 = colorEndpointModes[uVar26];
        if (0xf < uVar22) goto LAB_00acc71f;
        e0 = (ColorEndpointPair *)(e1 + -1);
        lVar10 = (long)iVar14;
        lVar19 = lVar10 * 4;
        pdVar31 = rgba + lVar10;
        switch(uVar22) {
        case 0:
          dVar41 = *pdVar31;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = dVar41;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = dVar41;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = dVar41;
          uVar7 = 0xff;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
          uVar40 = rgba[lVar10 + 1];
          goto LAB_00acbdc7;
        case 1:
          uVar43 = rgba[lVar10 + 1] & 0xc0 | *pdVar31 >> 2;
          uVar40 = (rgba[lVar10 + 1] & 0x3f) + uVar43;
          uVar7 = 0xff;
          if (0xfe < uVar40) {
            uVar40 = 0xff;
          }
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar43;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar43;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar43;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
          goto LAB_00acbfe7;
        case 2:
          uVar7 = *pdVar31 * 0x10;
          uVar34 = rgba[lVar10 + 1] * 0x10;
          uVar43 = uVar7 - 8;
          uVar40 = uVar34 + 8;
          if (*pdVar31 <= rgba[lVar10 + 1]) {
            uVar43 = uVar34;
            uVar40 = uVar7;
          }
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar40;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar40;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar40;
          uVar40 = 0x780;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0x780;
          e1->m_data[0] = uVar43;
          e1->m_data[1] = uVar43;
          goto LAB_00acc229;
        case 3:
          bVar46 = -1 < (char)*pdVar31;
          uVar40 = 0x1fc;
          if (bVar46) {
            uVar40 = 0xfe;
          }
          uVar7 = 0x7c;
          if (bVar46) {
            uVar7 = 0x1e;
          }
          uVar43 = *pdVar31 << (2U - bVar46 & 0x1f) & uVar40 |
                   (bVar46 + 0xe) * 0x100 & rgba[lVar10 + 1] << 4;
          uVar40 = (rgba[lVar10 + 1] << (2U - bVar46 & 0x1f) & uVar7) + uVar43;
          if (0xffe < uVar40) {
            uVar40 = 0xfff;
          }
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar43;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar43;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar43;
          uVar7 = 0x780;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0x780;
          goto LAB_00acbdc7;
        case 4:
          dVar41 = *pdVar31;
          uVar40 = rgba[lVar10 + 2];
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = dVar41;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = dVar41;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = dVar41;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar40;
          uVar40 = rgba[lVar10 + 1];
          uVar7 = rgba[lVar10 + 3];
LAB_00acbdc7:
          e1->m_data[0] = uVar40;
          e1->m_data[1] = uVar40;
          e1->m_data[2] = uVar40;
          e1->m_data[3] = uVar7;
          break;
        case 5:
          uVar40 = rgba[lVar10 + 1];
          uVar43 = uVar40 & 0x80 | (int)*pdVar31 >> 1;
          uVar7 = uVar43;
          if (0xfe < (int)uVar43) {
            uVar7 = 0xff;
          }
          if ((int)uVar7 < 1) {
            uVar7 = 0;
          }
          uVar34 = rgba[lVar10 + 3];
          uVar45 = uVar34 & 0x80 | (int)rgba[lVar10 + 2] >> 1;
          uVar44 = uVar45;
          if (0xfe < (int)uVar45) {
            uVar44 = 0xff;
          }
          if ((int)uVar44 < 1) {
            uVar44 = 0;
          }
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar7;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar7;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar7;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar44;
          uVar40 = uVar43 + (uVar40 >> 1 & 0x3f) + ((int)(uVar40 << 0x19) >> 0x1f & 0xffffffc0U);
          if (0xfe < (int)uVar40) {
            uVar40 = 0xff;
          }
          if ((int)uVar40 < 1) {
            uVar40 = 0;
          }
          uVar7 = uVar45 + (uVar34 >> 1 & 0x3f) + ((int)(uVar34 << 0x19) >> 0x1f & 0xffffffc0U);
          if (0xfe < (int)uVar7) {
            uVar7 = 0xff;
          }
          if ((int)uVar7 < 1) {
            uVar7 = 0;
          }
LAB_00acbfe7:
          e1->m_data[0] = uVar40;
          e1->m_data[1] = uVar40;
          e1->m_data[2] = uVar40;
          e1->m_data[3] = uVar7;
          break;
        case 6:
          dVar41 = rgba[lVar10 + 3];
          dVar16 = *pdVar31;
          uVar7 = rgba[lVar10 + 1];
          uVar43 = rgba[lVar10 + 2];
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = dVar41 * dVar16 >> 8;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar7 * dVar41 >> 8;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = dVar41 * uVar43 >> 8;
          uVar40 = 0xff;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
          goto LAB_00acc222;
        case 7:
          uVar22 = *pdVar31 >> 6 & 3;
          uVar13 = rgba[lVar10 + 1];
          uVar39 = uVar22 == 3 | 4;
          if ((rgba[lVar10 + 2] >> 6 & 2 | uVar13 >> 7 & 1) != 3) {
            uVar39 = uVar22;
          }
          DVar5 = (*(code *)(&DAT_00bc2b28 + *(int *)(&DAT_00bc2b28 + (ulong)uVar39 * 4)))
                            (&DAT_00bc2b28,rgba[lVar10 + 2] >> 5 & 1,
                             &DAT_00bc2b28 + *(int *)(&DAT_00bc2b28 + (ulong)uVar39 * 4),uVar13,
                             rgba[lVar10 + 3] >> 7 & 1,uVar13 >> 6 & 1);
          return DVar5;
        case 8:
          uVar40 = rgba[lVar10 + 1];
          uVar7 = rgba[lVar10 + 3];
          uVar43 = (&local_7a0)[lVar10 + -1];
          iVar33 = uVar43 + uVar40;
          uVar34 = rgba[lVar10 + 2];
          uVar44 = *(uint *)(local_7a8 + lVar19);
          iVar9 = uVar44 + *pdVar31;
          if (iVar33 + uVar7 < iVar9 + uVar34) {
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = iVar33 >> 1;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = (int)(uVar7 + uVar43) >> 1;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar43;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
            e1->m_data[0] = iVar9 >> 1;
            e1->m_data[1] = (int)(uVar34 + uVar44) >> 1;
            e1->m_data[2] = uVar44;
            e1->m_data[3] = 0xff;
          }
          else {
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = *pdVar31;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar34;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar44;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
            e1->m_data[0] = uVar40;
            e1->m_data[1] = uVar7;
            e1->m_data[2] = uVar43;
            e1->m_data[3] = 0xff;
          }
          break;
        case 9:
          uVar40 = rgba[lVar10 + 1];
          uVar7 = rgba[lVar10 + 3];
          uVar43 = (&local_7a0)[lVar10 + -1];
          uVar34 = uVar40 & 0x80 | (int)*pdVar31 >> 1;
          uVar44 = (int)(uVar40 << 0x19) >> 0x1f & 0xffffffc0U | uVar40 >> 1 & 0x3f;
          uVar40 = uVar7 & 0x80 | (int)rgba[lVar10 + 2] >> 1;
          uVar45 = (int)(uVar7 << 0x19) >> 0x1f & 0xffffffc0U | uVar7 >> 1 & 0x3f;
          uVar7 = uVar43 & 0x80 | *(int *)(local_7a8 + lVar19) >> 1;
          uVar43 = (int)(uVar43 << 0x19) >> 0x1f & 0xffffffc0U | uVar43 >> 1 & 0x3f;
          if ((int)(uVar45 + uVar44 + uVar43) < 0) {
            uVar43 = uVar43 + uVar7;
            uVar44 = (int)(uVar44 + uVar34 + uVar43) >> 1;
            if (0xfe < (int)uVar44) {
              uVar44 = 0xff;
            }
            if ((int)uVar44 < 1) {
              uVar44 = 0;
            }
            uVar45 = (int)(uVar45 + uVar40 + uVar43) >> 1;
            if (0xfe < (int)uVar45) {
              uVar45 = 0xff;
            }
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            if (0xfe < (int)uVar43) {
              uVar43 = 0xff;
            }
            if ((int)uVar43 < 1) {
              uVar43 = 0;
            }
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar44;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar45;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar43;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
            uVar43 = (int)(uVar34 + uVar7) >> 1;
            if (0xfe < (int)uVar43) {
              uVar43 = 0xff;
            }
            if ((int)uVar43 < 1) {
              uVar43 = 0;
            }
            uVar40 = (int)(uVar40 + uVar7) >> 1;
            if (0xfe < (int)uVar40) {
              uVar40 = 0xff;
            }
            if ((int)uVar40 < 1) {
              uVar40 = 0;
            }
            if (0xfe < (int)uVar7) {
              uVar7 = 0xff;
            }
            if ((int)uVar7 < 1) {
              uVar7 = 0;
            }
            e1->m_data[0] = uVar43;
            e1->m_data[1] = uVar40;
            e1->m_data[2] = uVar7;
          }
          else {
            uVar18 = uVar34;
            if (0xfe < (int)uVar34) {
              uVar18 = 0xff;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            uVar24 = uVar40;
            if (0xfe < (int)uVar40) {
              uVar24 = 0xff;
            }
            if ((int)uVar24 < 1) {
              uVar24 = 0;
            }
            uVar30 = uVar7;
            if (0xfe < (int)uVar7) {
              uVar30 = 0xff;
            }
            if ((int)uVar30 < 1) {
              uVar30 = 0;
            }
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar18;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar24;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar30;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
            uVar44 = uVar44 + uVar34;
            if (0xfe < (int)uVar44) {
              uVar44 = 0xff;
            }
            if ((int)uVar44 < 1) {
              uVar44 = 0;
            }
            uVar45 = uVar45 + uVar40;
            if (0xfe < (int)uVar45) {
              uVar45 = 0xff;
            }
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            uVar43 = uVar43 + uVar7;
            if (0xfe < (int)uVar43) {
              uVar43 = 0xff;
            }
            if ((int)uVar43 < 1) {
              uVar43 = 0;
            }
            e1->m_data[0] = uVar44;
            e1->m_data[1] = uVar45;
            e1->m_data[2] = uVar43;
          }
          e1->m_data[3] = 0xff;
          break;
        case 10:
          dVar41 = rgba[lVar10 + 3];
          dVar16 = *pdVar31;
          uVar7 = rgba[lVar10 + 1];
          uVar43 = rgba[lVar10 + 2];
          uVar40 = *(uint *)(local_7a8 + lVar19);
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = dVar41 * dVar16 >> 8;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar7 * dVar41 >> 8;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = dVar41 * uVar43 >> 8;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar40;
          uVar40 = (&local_7a0)[lVar10 + -1];
LAB_00acc222:
          e1->m_data[0] = dVar16;
          e1->m_data[1] = uVar7;
LAB_00acc229:
          e1->m_data[2] = uVar43;
LAB_00acc22d:
          e1->m_data[3] = uVar40;
          break;
        case 0xb:
          decodeHDREndpointMode11
                    ((UVec4 *)e0,e1,*pdVar31,rgba[lVar10 + 1],rgba[lVar10 + 2],rgba[lVar10 + 3],
                     *(deUint32 *)(local_7a8 + lVar19),(&local_7a0)[lVar10 + -1]);
          break;
        case 0xc:
          uVar40 = rgba[lVar10 + 1];
          uVar7 = rgba[lVar10 + 3];
          uVar43 = (&local_7a0)[lVar10 + -1];
          iVar33 = uVar43 + uVar40;
          uVar34 = rgba[lVar10 + 2];
          uVar44 = *(uint *)(local_7a8 + lVar19);
          iVar9 = uVar44 + *pdVar31;
          if (iVar33 + uVar7 < iVar9 + uVar34) {
            uVar40 = iVar33 >> 1;
            if (0xfe < (int)uVar40) {
              uVar40 = 0xff;
            }
            if ((int)uVar40 < 1) {
              uVar40 = 0;
            }
            uVar7 = (int)(uVar7 + uVar43) >> 1;
            if (0xfe < (int)uVar7) {
              uVar7 = 0xff;
            }
            if ((int)uVar7 < 1) {
              uVar7 = 0;
            }
            if (0xfe < (int)uVar43) {
              uVar43 = 0xff;
            }
            if ((int)uVar43 < 1) {
              uVar43 = 0;
            }
            uVar45 = local_79c[lVar10];
            if (0xfe < (int)uVar45) {
              uVar45 = 0xff;
            }
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar40;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar7;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar43;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar45;
            uVar40 = iVar9 >> 1;
            if (0xfe < (int)uVar40) {
              uVar40 = 0xff;
            }
            if ((int)uVar40 < 1) {
              uVar40 = 0;
            }
            uVar7 = (&local_7a0)[lVar10];
            uVar43 = (int)(uVar34 + uVar44) >> 1;
            if (0xfe < (int)uVar43) {
              uVar43 = 0xff;
            }
            if ((int)uVar43 < 1) {
              uVar43 = 0;
            }
            if (0xfe < (int)uVar44) {
              uVar44 = 0xff;
            }
            if ((int)uVar44 < 1) {
              uVar44 = 0;
            }
            if (0xfe < (int)uVar7) {
              uVar7 = 0xff;
            }
            if ((int)uVar7 < 1) {
              uVar7 = 0;
            }
            e1->m_data[0] = uVar40;
            e1->m_data[1] = uVar43;
            e1->m_data[2] = uVar44;
            e1->m_data[3] = uVar7;
          }
          else {
            uVar45 = (&local_7a0)[lVar10];
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = *pdVar31;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar34;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar44;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar45;
            uVar34 = local_79c[lVar10];
            e1->m_data[0] = uVar40;
            e1->m_data[1] = uVar7;
            e1->m_data[2] = uVar43;
            e1->m_data[3] = uVar34;
          }
          break;
        case 0xd:
          uVar40 = rgba[lVar10 + 1];
          uVar7 = rgba[lVar10 + 3];
          uVar43 = (&local_7a0)[lVar10 + -1];
          uVar34 = local_79c[lVar10];
          uVar18 = uVar40 & 0x80 | (int)*pdVar31 >> 1;
          uVar44 = (int)(uVar40 << 0x19) >> 0x1f & 0xffffffc0U | uVar40 >> 1 & 0x3f;
          uVar24 = uVar7 & 0x80 | (int)rgba[lVar10 + 2] >> 1;
          uVar45 = (int)(uVar7 << 0x19) >> 0x1f & 0xffffffc0U | uVar7 >> 1 & 0x3f;
          uVar30 = uVar43 & 0x80 | *(int *)(local_7a8 + lVar19) >> 1;
          uVar7 = (int)(uVar43 << 0x19) >> 0x1f & 0xffffffc0U | uVar43 >> 1 & 0x3f;
          uVar43 = uVar34 & 0x80 | (int)(&local_7a0)[lVar10] >> 1;
          uVar40 = (int)(uVar34 << 0x19) >> 0x1f & 0xffffffc0U | uVar34 >> 1 & 0x3f;
          if (-1 < (int)(uVar45 + uVar44 + uVar7)) {
            uVar34 = uVar18;
            if (0xfe < (int)uVar18) {
              uVar34 = 0xff;
            }
            if ((int)uVar34 < 1) {
              uVar34 = 0;
            }
            uVar25 = uVar24;
            if (0xfe < (int)uVar24) {
              uVar25 = 0xff;
            }
            if ((int)uVar25 < 1) {
              uVar25 = 0;
            }
            uVar42 = uVar30;
            if (0xfe < (int)uVar30) {
              uVar42 = 0xff;
            }
            if ((int)uVar42 < 1) {
              uVar42 = 0;
            }
            uVar36 = uVar43;
            if (0xfe < (int)uVar43) {
              uVar36 = 0xff;
            }
            if ((int)uVar36 < 1) {
              uVar36 = 0;
            }
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar34;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar25;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar42;
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar36;
            uVar44 = uVar44 + uVar18;
            if (0xfe < (int)uVar44) {
              uVar44 = 0xff;
            }
            if ((int)uVar44 < 1) {
              uVar44 = 0;
            }
            uVar45 = uVar45 + uVar24;
            if (0xfe < (int)uVar45) {
              uVar45 = 0xff;
            }
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            uVar7 = uVar7 + uVar30;
            if (0xfe < (int)uVar7) {
              uVar7 = 0xff;
            }
            if ((int)uVar7 < 1) {
              uVar7 = 0;
            }
            uVar40 = uVar40 + uVar43;
            if (0xfe < (int)uVar40) {
              uVar40 = 0xff;
            }
            if ((int)uVar40 < 1) {
              uVar40 = 0;
            }
            e1->m_data[0] = uVar44;
            e1->m_data[1] = uVar45;
            e1->m_data[2] = uVar7;
            goto LAB_00acc22d;
          }
          uVar7 = uVar7 + uVar30;
          uVar34 = (int)(uVar44 + uVar18 + uVar7) >> 1;
          if (0xfe < (int)uVar34) {
            uVar34 = 0xff;
          }
          if ((int)uVar34 < 1) {
            uVar34 = 0;
          }
          uVar44 = (int)(uVar45 + uVar24 + uVar7) >> 1;
          if (0xfe < (int)uVar44) {
            uVar44 = 0xff;
          }
          if ((int)uVar44 < 1) {
            uVar44 = 0;
          }
          if (0xfe < (int)uVar7) {
            uVar7 = 0xff;
          }
          if ((int)uVar7 < 1) {
            uVar7 = 0;
          }
          uVar40 = uVar40 + uVar43;
          if (0xfe < (int)uVar40) {
            uVar40 = 0xff;
          }
          if ((int)uVar40 < 1) {
            uVar40 = 0;
          }
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar34;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar44;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar7;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar40;
          uVar40 = (int)(uVar18 + uVar30) >> 1;
          if (0xfe < (int)uVar40) {
            uVar40 = 0xff;
          }
          if ((int)uVar40 < 1) {
            uVar40 = 0;
          }
          uVar7 = (int)(uVar24 + uVar30) >> 1;
          if (0xfe < (int)uVar7) {
            uVar7 = 0xff;
          }
          if ((int)uVar7 < 1) {
            uVar7 = 0;
          }
          if (0xfe < (int)uVar30) {
            uVar30 = 0xff;
          }
          if ((int)uVar30 < 1) {
            uVar30 = 0;
          }
          if (0xfe < (int)uVar43) {
            uVar43 = 0xff;
          }
          if ((int)uVar43 < 1) {
            uVar43 = 0;
          }
          e1->m_data[0] = uVar40;
          e1->m_data[1] = uVar7;
          e1->m_data[2] = uVar30;
          e1->m_data[3] = uVar43;
          break;
        case 0xe:
          decodeHDREndpointMode11
                    ((UVec4 *)e0,e1,*pdVar31,rgba[lVar10 + 1],rgba[lVar10 + 2],rgba[lVar10 + 3],
                     *(deUint32 *)(local_7a8 + lVar19),(&local_7a0)[lVar10 + -1]);
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = (&local_7a0)[lVar10];
          uVar40 = local_79c[lVar10];
          goto LAB_00acc22d;
        case 0xf:
          uVar40 = (&local_7a0)[lVar10];
          uVar7 = local_79c[lVar10];
          decodeHDREndpointMode11
                    ((UVec4 *)e0,e1,*pdVar31,rgba[lVar10 + 1],rgba[lVar10 + 2],rgba[lVar10 + 3],
                     *(deUint32 *)(local_7a8 + lVar19),(&local_7a0)[lVar10 + -1]);
          uVar43 = uVar40 >> 7 & 1 | uVar7 >> 6 & 2;
          uVar40 = uVar40 & 0x7f;
          if (uVar43 == 3) {
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar40 << 5;
            e1->m_data[3] = (uVar7 & 0x7f) << 5;
          }
          else {
            sVar4 = (sbyte)uVar43;
            uVar40 = (uVar7 & 0x7f) << sVar4 + 1 & 0x780 | uVar40;
            uVar7 = ((0x3fU >> sVar4 & uVar7 ^ 0x20U >> sVar4) - (0x20U >> sVar4)) + uVar40 <<
                    (4U - sVar4 & 0x1f);
            if (0xffe < (int)uVar7) {
              uVar7 = 0xfff;
            }
            if ((int)uVar7 < 1) {
              uVar7 = 0;
            }
            (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar40 << (4U - sVar4 & 0x1f);
            e1->m_data[3] = uVar7;
          }
        }
LAB_00acc71f:
        iVar9 = blockMode.weightGridHeight;
        iVar33 = blockMode.weightGridWidth;
        bVar46 = blockMode.isDualPlane;
        iVar14 = iVar14 + (uVar22 >> 2) * 2 + 2;
        uVar26 = uVar26 + 1;
        e1 = e1 + 2;
      } while (uVar29 != uVar26);
      iVar14 = blockMode.weightGridHeight * blockMode.weightGridWidth;
      bVar12 = blockMode.isDualPlane & 0x1f;
      uVar22 = iVar14 << bVar12;
      IVar28 = blockMode.weightISEParams.mode;
      if (blockMode.weightISEParams.mode == ISEMODE_PLAIN_BIT) {
        texelWeights[1].w[1] = blockMode.weightISEParams.numBits * uVar22;
      }
      else {
        if (blockMode.weightISEParams.mode == ISEMODE_QUINT) {
          iVar17 = (int)(uVar22 * 7) / 3;
          bVar47 = uVar22 * -0x55555553 + 0x2aaaaaaa < 0x55555555;
        }
        else {
          texelWeights[1].w[1] = 0xffffffff;
          if (blockMode.weightISEParams.mode != ISEMODE_TRIT) goto LAB_00acc7fe;
          iVar17 = (int)(uVar22 * 8) / 5;
          bVar47 = uVar22 * 0x66666668 + 0x19999999 < 0x33333333;
        }
        texelWeights[1].w[1] =
             blockMode.weightISEParams.numBits * uVar22 + ((iVar17 + 1) - (uint)bVar47);
      }
LAB_00acc7fe:
      texelWeights[1].w[0] = 0x7f;
      texelWeights[2].w[0]._0_1_ = 0;
      texelWeights[2].w[1] = 0;
      texelWeights[0].w = (deUint32  [2])blockData;
      decodeISE((ISEDecodedResult *)rgba,uVar22,(BitAccessStream *)texelWeights,
                &blockMode.weightISEParams);
      if (IVar28 < ISEMODE_PLAIN_BIT) {
        iVar17 = (uint)(IVar28 == ISEMODE_QUINT) + blockMode.weightISEParams.numBits * 2;
        if (blockMode.weightISEParams.numBits * 2 == 0) {
          puVar11 = astc::(anonymous_namespace)::
                    unquantizeWeights(unsigned_int*,tcu::astc::(anonymous_namespace)::ISEDecodedResult_const*,tcu::astc::(anonymous_namespace)::ASTCBlockMode_const&)
                    ::map1;
          if (iVar17 == 0) {
            puVar11 = astc::(anonymous_namespace)::
                      unquantizeWeights(unsigned_int*,tcu::astc::(anonymous_namespace)::ISEDecodedResult_const*,tcu::astc::(anonymous_namespace)::ASTCBlockMode_const&)
                      ::map0;
          }
          if (0 < iVar14 << bVar12) {
            puVar27 = rgba + 2;
            uVar26 = 0;
            do {
              (&local_8b8[0].mode)[uVar26] = *(ISEMode *)(puVar11 + (ulong)*puVar27 * 4);
              uVar26 = uVar26 + 1;
              puVar27 = puVar27 + 3;
            } while (uVar22 != uVar26);
          }
        }
        else if (0 < iVar14 << bVar12) {
          iVar6 = *(int *)(astc::(anonymous_namespace)::
                           unquantizeWeights(unsigned_int*,tcu::astc::(anonymous_namespace)::ISEDecodedResult_const*,tcu::astc::(anonymous_namespace)::ASTCBlockMode_const&)
                           ::Ca + (long)(iVar17 + -2) * 4);
          pdVar31 = rgba + 1;
          uVar26 = 0;
          do {
            uVar40 = pdVar31[-1];
            uVar7 = 0;
            if (blockMode.weightISEParams.numBits * 2 != 2) {
              uVar43 = uVar40 >> 1 & 1;
              if (iVar17 == 6) {
                uVar7 = uVar40 >> 2 & 1;
                uVar7 = (uVar43 << 5 | uVar7 << 6) + uVar7 * 2 | uVar43;
              }
              else if (iVar17 == 5) {
                uVar7 = uVar43 * 0x42;
              }
              else {
                uVar7 = 0xffffffff;
                if (iVar17 == 4) {
                  uVar7 = uVar43 * 0x45;
                }
              }
            }
            (&local_8b8[0].mode)[uVar26] =
                 -(uVar40 & 1) & 0x20 | (*pdVar31 * iVar6 + uVar7 ^ -(uVar40 & 1) & 0x7f) >> 2;
            uVar26 = uVar26 + 1;
            pdVar31 = pdVar31 + 3;
          } while (uVar22 != uVar26);
        }
      }
      else if (0 < iVar14 << bVar12) {
        iVar17 = -blockMode.weightISEParams.numBits;
        iVar6 = 6 - blockMode.weightISEParams.numBits;
        uVar26 = 0;
        do {
          IVar28 = ISEMODE_TRIT;
          if (iVar6 != iVar17 &&
              SBORROW4(iVar6,iVar17) == iVar6 + blockMode.weightISEParams.numBits < 0) {
            IVar28 = ISEMODE_TRIT;
            iVar23 = iVar6;
            iVar8 = blockMode.weightISEParams.numBits + -6;
            do {
              IVar38 = rgba[uVar26 * 3 + 2] >> ((byte)iVar8 & 0x1f);
              if (-1 < iVar23) {
                IVar38 = rgba[uVar26 * 3 + 2] << ((byte)iVar23 & 0x1f);
              }
              IVar28 = IVar28 | IVar38;
              iVar23 = iVar23 - blockMode.weightISEParams.numBits;
              iVar8 = iVar8 + blockMode.weightISEParams.numBits;
            } while (iVar23 != iVar17 &&
                     SBORROW4(iVar23,iVar17) == iVar23 + blockMode.weightISEParams.numBits < 0);
          }
          (&local_8b8[0].mode)[uVar26] = IVar28;
          uVar26 = uVar26 + 1;
        } while (uVar26 != uVar22);
      }
      if (0 < iVar14 << bVar12) {
        uVar26 = 0;
        do {
          (&local_8b8[0].mode)[uVar26] =
               ((&local_8b8[0].mode)[uVar26] + ISEMODE_QUINT) -
               (uint)((&local_8b8[0].mode)[uVar26] < 0x21);
          uVar26 = uVar26 + 1;
        } while (uVar22 != uVar26);
      }
      if ((int)uVar22 < 0x40) {
        memset(&local_8b8[0].mode + (int)uVar22,0xff,(ulong)(0x3f - uVar22) * 4 + 4);
      }
      if (0 < blockHeight) {
        iVar14 = 0;
        local_a1c = 0;
        do {
          if (0 < blockWidth) {
            uVar22 = (iVar9 + -1) *
                     (int)((long)(ulong)(((uint)blockHeight >> 1) + 0x400) /
                          (long)(blockHeight + -1)) * local_a1c + 0x20;
            uVar40 = uVar22 >> 6 & 0xf;
            iVar6 = (uVar22 >> 10) * iVar33;
            uVar26 = 0;
            iVar17 = iVar14;
            do {
              uVar22 = (iVar33 + -1) * ((blockWidth / 2 + 0x400) / (blockWidth + -1)) * (int)uVar26
                       + 0x20;
              uVar7 = uVar22 >> 10;
              uVar22 = uVar22 >> 6 & 0xf;
              uVar43 = uVar22 * uVar40 + 8 >> 4;
              iVar8 = uVar7 + iVar6;
              lVar19 = 0;
              do {
                iVar23 = (int)lVar19;
                texelWeights[iVar17].w[lVar19] =
                     (&local_8b8[0].mode)[iVar23 + (iVar8 + iVar33 << (bVar46 & 0x1fU)) & 0x3f] *
                     (uVar40 - uVar43) +
                     (&local_8b8[0].mode)[(uVar7 + iVar6 + 1 << (bVar46 & 0x1fU)) + iVar23 & 0x3f] *
                     (uVar22 - uVar43) +
                     (&local_8b8[0].mode)[(iVar8 << (bVar46 & 0x1fU)) + iVar23 & 0x3f] *
                     ((uVar43 - (uVar40 + uVar22)) + 0x10) +
                     (&local_8b8[0].mode)[(iVar33 + iVar8 + 1 << (bVar46 & 0x1fU)) + iVar23 & 0x3f]
                     * uVar43 + 8 >> 4;
                if (lVar19 != 0) break;
                lVar19 = 1;
              } while (bVar46 != false);
              uVar26 = uVar26 + 1;
              iVar17 = iVar17 + 1;
            } while (uVar26 != (uint)blockWidth);
          }
          local_a1c = local_a1c + 1;
          iVar14 = iVar14 + blockWidth;
        } while (local_a1c != blockHeight);
      }
      uVar26 = 0xffffffff;
      if (bVar46 != false) {
        dVar41 = Block128::getBits(blockData,iVar15 + 0x7d,iVar15 + 0x7e);
        uVar26 = (ulong)dVar41;
      }
      WVar2 = blockData->m_words[0];
      uVar35 = 0;
      do {
        if (colorEndpointModes[uVar35] - 2 < 0xe) {
          uVar32 = (&DAT_00bc5360)[colorEndpointModes[uVar35] - 2];
        }
        else {
          uVar32 = 0;
        }
        *(undefined1 *)((long)rgba + uVar35) = uVar32;
        uVar35 = uVar35 + 1;
      } while (uVar29 != uVar35);
      if (blockHeight < 1) {
        return DECOMPRESS_RESULT_VALID_BLOCK;
      }
      bVar46 = blockHeight * blockWidth < 0x1f;
      uVar40 = -(uint)((uVar3 & 3) == 0) | (uint)WVar2 >> 0xd & 0x3ff;
      uVar22 = (uVar13 * 0x400 + uVar40) - 0x400;
      uVar22 = (uVar22 >> 0xf ^ uVar22) * -0x1121f76f;
      uVar22 = (uVar22 >> 5 ^ uVar22) * 0x10001;
      uVar22 = uVar22 >> 7 ^ uVar22;
      uVar22 = uVar22 >> 3 ^ uVar22;
      uVar22 = uVar22 << 6 ^ uVar22;
      uVar34 = uVar22 >> 0x11 ^ uVar22;
      uVar43 = uVar34 >> 8 & 0xf;
      uVar44 = uVar34 >> 0xc & 0xf;
      uVar45 = uVar22 >> 0x18 & 0xf;
      uVar7 = uVar34 >> 4 & 0xf;
      bVar12 = (uVar40 & 2) == 0 | 4;
      bVar20 = (uVar13 == 3) + 5;
      bVar21 = bVar20;
      if ((uVar40 & 1) == 0) {
        bVar21 = bVar12;
        bVar12 = bVar20;
      }
      uVar40 = uVar22 >> 0x14 & 0xf;
      uVar13 = uVar22 >> 0x10 & 0xf;
      local_9ac = 0;
      local_9c4 = DECOMPRESS_RESULT_VALID_BLOCK;
      local_9b0 = 0;
      do {
        if (0 < blockWidth) {
          iVar33 = local_9b0 << bVar46;
          uVar29 = 0;
          iVar14 = local_9ac;
          do {
            if ((uVar3 & 3) == 0) {
LAB_00accf3c:
              lVar19 = 0;
            }
            else {
              iVar9 = (int)uVar29 << bVar46;
              uVar30 = iVar9 * ((uVar34 & 0xf) * (uVar34 & 0xf) >> bVar12) +
                       iVar33 * (uVar7 * uVar7 >> bVar21) + (uVar34 >> 0xe) & 0x3f;
              uVar18 = iVar9 * (uVar43 * uVar43 >> bVar12) +
                       iVar33 * (uVar44 * uVar44 >> bVar21) + (uVar34 >> 10) & 0x3f;
              uVar24 = iVar9 * (uVar13 * uVar13 >> bVar12) +
                       iVar33 * (uVar40 * uVar40 >> bVar21) + (uVar34 >> 6) & 0x3f;
              if (uVar39 < 2) {
                uVar24 = 0;
              }
              uVar25 = iVar9 * (uVar45 * uVar45 >> bVar12) +
                       iVar33 * ((uVar22 >> 0x1c) * (uVar22 >> 0x1c) >> bVar21) + (uVar34 >> 2) &
                       0x3f;
              if (uVar39 != 3) {
                uVar25 = 0;
              }
              if (((uVar18 <= uVar30) && (uVar24 <= uVar30)) && (uVar25 <= uVar30))
              goto LAB_00accf3c;
              if ((uVar18 < uVar24) || (lVar19 = 1, uVar18 < uVar25)) {
                lVar19 = (ulong)(uVar24 < uVar25) + 2;
              }
            }
            iVar9 = local_9b0 * blockWidth + (int)uVar29;
            if ((isLDR) && (*(char *)((long)rgba + lVar19) == '\x01')) {
              lVar19 = (long)(iVar9 * 4);
              if (isSRGB) {
                *(undefined1 *)((long)dst + lVar19) = 0xff;
                *(undefined1 *)((long)dst + lVar19 + 1) = 0;
                *(undefined1 *)((long)dst + lVar19 + 2) = 0xff;
                *(undefined1 *)((long)dst + lVar19 + 3) = 0xff;
              }
              else {
                *(undefined4 *)((long)dst + lVar19 * 4) = 0x3f800000;
                *(undefined4 *)((long)dst + (lVar19 + 1) * 4) = 0;
                *(undefined4 *)((long)dst + (lVar19 + 2) * 4) = 0x3f800000;
                *(undefined4 *)((long)dst + (lVar19 + 3) * 4) = 0x3f800000;
              }
              local_9c4 = DECOMPRESS_RESULT_ERROR;
            }
            else {
              lVar10 = (long)iVar14;
              cVar1 = *(char *)((long)rgba + lVar19);
              uVar35 = 0;
              do {
                if ((cVar1 == '\0') || ((uVar35 == 3 && (colorEndpointModes[lVar19] == 0xe)))) {
                  uVar18 = colorEndpoints[lVar19].e0.m_data[uVar35];
                  uVar24 = colorEndpoints[lVar19].e1.m_data[uVar35];
                  uVar25 = uVar18 << 8;
                  uVar30 = uVar24;
                  if (isSRGB) {
                    uVar18 = 0x80;
                    uVar30 = 0x80;
                  }
                  uVar18 = (uVar24 << 8 | uVar30) * texelWeights[iVar9].w[uVar26 == uVar35] +
                           (0x40 - texelWeights[iVar9].w[uVar26 == uVar35]) * (uVar18 | uVar25) +
                           0x20;
                  if (isSRGB) {
                    *(char *)((long)dst + uVar35 + lVar10) = (char)(uVar18 >> 0xe);
                  }
                  else {
                    uVar18 = uVar18 >> 6;
                    fVar48 = 1.0;
                    if (uVar18 != 0xffff) {
                      fVar48 = (float)uVar18 * 1.5258789e-05;
                    }
                    *(float *)((long)dst + uVar35 * 4 + lVar10 * 4) = fVar48;
                  }
                }
                else {
                  uVar24 = (texelWeights[iVar9].w[uVar26 == uVar35] *
                            colorEndpoints[lVar19].e1.m_data[uVar35] +
                           (0x40 - texelWeights[iVar9].w[uVar26 == uVar35]) *
                           colorEndpoints[lVar19].e0.m_data[uVar35]) * 0x10 + 0x20;
                  uVar18 = uVar24 >> 6 & 0x7ff;
                  if (uVar18 < 0x200) {
                    uVar18 = uVar18 * 3;
                  }
                  else if (uVar18 < 0x600) {
                    uVar18 = uVar18 * 4 - 0x200;
                  }
                  else {
                    uVar18 = uVar18 * 5 - 0x800;
                  }
                  uVar18 = (uVar18 >> 3) + (uVar24 >> 7 & 0x7c00);
                  val16 = 0x7bff;
                  if ((~uVar18 & 0x7c00) != 0) {
                    val16 = (deFloat16)uVar18;
                  }
                  fVar48 = deFloat16To32(val16);
                  *(float *)((long)dst + uVar35 * 4 + lVar10 * 4) = fVar48;
                }
                uVar35 = uVar35 + 1;
              } while (uVar35 != 4);
            }
            uVar29 = uVar29 + 1;
            iVar14 = iVar14 + 4;
          } while (uVar29 != (uint)blockWidth);
        }
        local_9b0 = local_9b0 + 1;
        local_9ac = local_9ac + blockWidth * 4;
        if (local_9b0 == blockHeight) {
          return local_9c4;
        }
      } while( true );
    }
  }
  uVar13 = blockHeight * blockWidth;
  if (isSRGB) {
    if (0 < (int)uVar13) {
      lVar19 = 0;
      do {
        iVar14 = (int)lVar19;
        *(undefined1 *)((long)dst + (long)iVar14) = 0xff;
        *(undefined2 *)((long)dst + (long)(iVar14 + 1)) = 0xff00;
        *(undefined1 *)((long)dst + (long)(iVar14 + 3)) = 0xff;
        lVar19 = lVar19 + 4;
      } while ((ulong)uVar13 << 2 != lVar19);
    }
  }
  else if (0 < (int)uVar13) {
    lVar19 = 0;
    do {
      iVar14 = (int)lVar19;
      *(undefined4 *)((long)dst + (long)iVar14 * 4) = 0x3f800000;
      *(undefined4 *)((long)dst + (long)(iVar14 + 1) * 4) = 0;
      *(undefined4 *)((long)dst + (long)(iVar14 + 2) * 4) = 0x3f800000;
      *(undefined4 *)((long)dst + (long)(iVar14 + 3) * 4) = 0x3f800000;
      lVar19 = lVar19 + 4;
    } while ((ulong)uVar13 << 2 != lVar19);
  }
  return DECOMPRESS_RESULT_ERROR;
}

Assistant:

DecompressResult decompressBlock (void* dst, const Block128& blockData, int blockWidth, int blockHeight, bool isSRGB, bool isLDR)
{
	DE_ASSERT(isLDR || !isSRGB);

	// Decode block mode.

	const ASTCBlockMode blockMode = getASTCBlockMode(blockData.getBits(0, 10));

	// Check for block mode errors.

	if (blockMode.isError)
	{
		setASTCErrorColorBlock(dst, blockWidth, blockHeight, isSRGB);
		return DECOMPRESS_RESULT_ERROR;
	}

	// Separate path for void-extent.

	if (blockMode.isVoidExtent)
		return decodeVoidExtentBlock(dst, blockData, blockWidth, blockHeight, isSRGB, isLDR);

	// Compute weight grid values.

	const int numWeights			= computeNumWeights(blockMode);
	const int numWeightDataBits		= computeNumRequiredBits(blockMode.weightISEParams, numWeights);
	const int numPartitions			= (int)blockData.getBits(11, 12) + 1;

	// Check for errors in weight grid, partition and dual-plane parameters.

	if (numWeights > 64								||
		numWeightDataBits > 96						||
		numWeightDataBits < 24						||
		blockMode.weightGridWidth > blockWidth		||
		blockMode.weightGridHeight > blockHeight	||
		(numPartitions == 4 && blockMode.isDualPlane))
	{
		setASTCErrorColorBlock(dst, blockWidth, blockHeight, isSRGB);
		return DECOMPRESS_RESULT_ERROR;
	}

	// Compute number of bits available for color endpoint data.

	const bool	isSingleUniqueCem			= numPartitions == 1 || blockData.getBits(23, 24) == 0;
	const int	numConfigDataBits			= (numPartitions == 1 ? 17 : isSingleUniqueCem ? 29 : 25 + 3*numPartitions) +
											  (blockMode.isDualPlane ? 2 : 0);
	const int	numBitsForColorEndpoints	= 128 - numWeightDataBits - numConfigDataBits;
	const int	extraCemBitsStart			= 127 - numWeightDataBits - (isSingleUniqueCem		? -1
																		: numPartitions == 4	? 7
																		: numPartitions == 3	? 4
																		: numPartitions == 2	? 1
																		: 0);
	// Decode color endpoint modes.

	deUint32 colorEndpointModes[4];
	decodeColorEndpointModes(&colorEndpointModes[0], blockData, numPartitions, extraCemBitsStart);

	const int numColorEndpointValues = computeNumColorEndpointValues(colorEndpointModes, numPartitions);

	// Check for errors in color endpoint value count.

	if (numColorEndpointValues > 18 || numBitsForColorEndpoints < deDivRoundUp32(13*numColorEndpointValues, 5))
	{
		setASTCErrorColorBlock(dst, blockWidth, blockHeight, isSRGB);
		return DECOMPRESS_RESULT_ERROR;
	}

	// Compute color endpoints.

	ColorEndpointPair colorEndpoints[4];
	computeColorEndpoints(&colorEndpoints[0], blockData, &colorEndpointModes[0], numPartitions, numColorEndpointValues,
						  computeMaximumRangeISEParams(numBitsForColorEndpoints, numColorEndpointValues), numBitsForColorEndpoints);

	// Compute texel weights.

	TexelWeightPair texelWeights[MAX_BLOCK_WIDTH*MAX_BLOCK_HEIGHT];
	computeTexelWeights(&texelWeights[0], blockData, blockWidth, blockHeight, blockMode);

	// Set texel colors.

	const int		ccs						= blockMode.isDualPlane ? (int)blockData.getBits(extraCemBitsStart-2, extraCemBitsStart-1) : -1;
	const deUint32	partitionIndexSeed		= numPartitions > 1 ? blockData.getBits(13, 22) : (deUint32)-1;

	return setTexelColors(dst, &colorEndpoints[0], &texelWeights[0], ccs, partitionIndexSeed, numPartitions, blockWidth, blockHeight, isSRGB, isLDR, &colorEndpointModes[0]);
}